

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O1

int apply_moves(node *newest_node,Pyraminx *pyraminx)

{
  pointer pmVar1;
  vector<move_type,_std::allocator<move_type>_> move_list;
  vector<move_type,_std::allocator<move_type>_> local_28;
  
  get_move_list(&local_28,newest_node);
  for (pmVar1 = local_28.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pmVar1 != local_28.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                super__Vector_impl_data._M_start; pmVar1 = pmVar1 + -1) {
    Pyraminx::turn_layer(pyraminx,pmVar1[-1].ref_corner,pmVar1[-1].layer,pmVar1[-1].dir);
  }
  if (local_28.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<move_type,_std::allocator<move_type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)local_28.super__Vector_base<move_type,_std::allocator<move_type>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_28.super__Vector_base<move_type,_std::allocator<move_type>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
}

Assistant:

int apply_moves(const node* newest_node, Pyraminx& pyraminx){
    std::vector<move_type> move_list = get_move_list(newest_node);
    for(auto it = move_list.rbegin(); it != move_list.rend(); ++it){
        pyraminx.turn_layer(it->ref_corner, it->layer, it->dir);
    }
    return move_list.size(); // new g value
}